

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderPass.cpp
# Opt level: O3

Ptr<RenderPass> __thiscall
myvk::RenderPass::Create(RenderPass *this,Ptr<Device> *device,VkRenderPassCreateInfo2 *create_info)

{
  VkResult VVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  Ptr<RenderPass> PVar3;
  undefined1 local_39;
  _func_int **local_38;
  element_type *peStack_30;
  
  std::__shared_ptr<myvk::RenderPass,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<myvk::RenderPass>>
            ((__shared_ptr<myvk::RenderPass,(__gnu_cxx::_Lock_policy)2> *)&local_38,
             (allocator<myvk::RenderPass> *)&local_39);
  local_38[3] = (_func_int *)
                (device->super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_38 + 4),
             &(device->super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
  VVar1 = (*vkCreateRenderPass2)
                    (((device->super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                     ->m_device,create_info,(VkAllocationCallbacks *)0x0,
                     (VkRenderPass *)(local_38 + 5));
  _Var2._M_pi = extraout_RDX;
  if (VVar1 == VK_SUCCESS) {
    (this->super_DeviceObjectBase).super_Base._vptr_Base = local_38;
    (this->super_DeviceObjectBase).super_Base.super_enable_shared_from_this<myvk::Base>._M_weak_this
    .super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peStack_30;
  }
  else {
    (this->super_DeviceObjectBase).super_Base._vptr_Base = (_func_int **)0x0;
    (this->super_DeviceObjectBase).super_Base.super_enable_shared_from_this<myvk::Base>._M_weak_this
    .super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    if (peStack_30 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_30);
      _Var2._M_pi = extraout_RDX_00;
    }
  }
  PVar3.super___shared_ptr<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  PVar3.super___shared_ptr<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Ptr<RenderPass>)PVar3.super___shared_ptr<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<RenderPass> RenderPass::Create(const Ptr<Device> &device, const VkRenderPassCreateInfo2 &create_info) {
	auto ret = std::make_shared<RenderPass>();
	ret->m_device_ptr = device;

	if (vkCreateRenderPass2(device->GetHandle(), &create_info, nullptr, &ret->m_render_pass) != VK_SUCCESS)
		return nullptr;
	return ret;
}